

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintColumn(cmDocumentationFormatter *this,ostream *os,string *text)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  char *pcVar4;
  char *ptr;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar1 = this->TextWidth;
  uVar2 = this->TextIndent;
  if (uVar1 <= uVar2) {
    __assert_fail("this->TextIndent < this->TextWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDocumentationFormatter.cxx"
                  ,0x7d,
                  "void cmDocumentationFormatter::PrintColumn(std::ostream &, const std::string &) const"
                 );
  }
  ptr = (text->_M_dataplus)._M_p;
  pcVar4 = anon_unknown.dwarf_a91d4::skipToSpace(ptr);
  bVar3 = true;
  bVar7 = false;
  lVar6 = 0;
  do {
    if (*ptr == '\0') {
      return;
    }
    lVar5 = (long)pcVar4 - (long)ptr;
    if (lVar5 < (long)(uVar1 - (uVar2 + lVar6 + (ulong)bVar7))) {
      if (ptr < pcVar4) {
        if (lVar6 == 0) {
          if (this->TextIndent == 0 || bVar3) {
            lVar6 = 0;
          }
          else {
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct((ulong)local_50,(char)this->TextIndent);
            std::operator<<(os,(string *)local_50);
            std::__cxx11::string::~string((string *)local_50);
            lVar6 = 0;
          }
        }
        else {
          std::operator<<(os,"RPATH_REMOVE could not remove RPATH from file: \n  " +
                             (ulong)(bVar7 ^ 1) + 0x30);
          lVar6 = lVar6 + (ulong)bVar7 + 1;
        }
        std::ostream::write((char *)os,(long)ptr);
        bVar7 = pcVar4[-1] == '.';
      }
      if (*pcVar4 == '\n') {
        std::operator<<(os,'\n');
        pcVar4 = pcVar4 + 1;
LAB_00195e8c:
        bVar3 = false;
        lVar5 = 0;
      }
      else {
        lVar5 = lVar5 + lVar6;
      }
    }
    else {
      std::operator<<(os,'\n');
      if (pcVar4 <= ptr) goto LAB_00195e8c;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)this->TextIndent);
      std::operator<<(os,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      std::ostream::write((char *)os,(long)ptr);
      bVar7 = pcVar4[-1] == '.';
      bVar3 = false;
    }
    ptr = pcVar4 + -1;
    do {
      pcVar4 = ptr + 1;
      ptr = ptr + 1;
    } while (*pcVar4 == ' ');
    pcVar4 = anon_unknown.dwarf_a91d4::skipToSpace(ptr);
    lVar6 = lVar5;
  } while( true );
}

Assistant:

void cmDocumentationFormatter::PrintColumn(std::ostream& os,
                                           std::string const& text) const
{
  // Print text arranged in an indented column of fixed width.
  bool newSentence = false;
  bool firstLine = true;

  assert(this->TextIndent < this->TextWidth);
  const std::ptrdiff_t width = this->TextWidth - this->TextIndent;
  std::ptrdiff_t column = 0;

  // Loop until the end of the text.
  for (const char *l = text.c_str(), *r = skipToSpace(text.c_str()); *l;
       l = skipSpaces(r), r = skipToSpace(l)) {
    // Does it fit on this line?
    if (r - l < width - column - std::ptrdiff_t(newSentence)) {
      // Word fits on this line.
      if (r > l) {
        if (column) {
          // Not first word on line.  Separate from the previous word
          // by a space, or two if this is a new sentence.
          os << &("  "[std::size_t(!newSentence)]);
          column += 1u + std::ptrdiff_t(newSentence);
        } else if (!firstLine && this->TextIndent) {
          // First word on line.  Print indentation unless this is the
          // first line.
          os << std::string(this->TextIndent, ' ');
        }

        // Print the word.
        os.write(l, r - l);
        newSentence = (*(r - 1) == '.');
      }

      if (*r == '\n') {
        // Text provided a newline.  Start a new line.
        os << '\n';
        ++r;
        column = 0;
        firstLine = false;
      } else {
        // No provided newline.  Continue this line.
        column += r - l;
      }
    } else {
      // Word does not fit on this line.  Start a new line.
      os << '\n';
      firstLine = false;
      if (r > l) {
        os << std::string(this->TextIndent, ' ');
        os.write(l, r - l);
        column = r - l;
        newSentence = (*(r - 1) == '.');
      } else {
        column = 0;
      }
    }
    // Move to beginning of next word.  Skip over whitespace.
  }
}